

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O0

void HighsTaskExecutor::sync_stolen_task(HighsSplitDeque *localDeque,HighsTask *stolenTask)

{
  bool bVar1;
  int iVar2;
  rep_conflict rVar3;
  HighsSplitDeque *in_RSI;
  HighsSplitDeque *in_RDI;
  HighsSplitDeque *unaff_retaddr;
  rep_conflict numMicroSecs;
  int s;
  time_point tStart;
  int numTries;
  int numWorkers;
  HighsSplitDeque *stealer;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffa8;
  HighsSplitDeque *in_stack_ffffffffffffffb0;
  type in_stack_ffffffffffffffb8;
  duration<long,_std::ratio<1L,_1000000L>_> in_stack_ffffffffffffffc0;
  HighsSplitDeque *in_stack_ffffffffffffffc8;
  int local_2c;
  int local_20;
  
  bVar1 = HighsSplitDeque::leapfrogStolenTask
                    (in_stack_ffffffffffffffc8,(HighsTask *)in_stack_ffffffffffffffc0.__r,
                     (HighsSplitDeque **)in_stack_ffffffffffffffb8.__r);
  if (!bVar1) {
    iVar2 = HighsSplitDeque::getNumWorkers(in_RDI);
    local_20 = (iVar2 + -1) * 0x10;
    std::chrono::_V2::system_clock::now();
    while( true ) {
      for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
        bVar1 = HighsTask::isFinished((HighsTask *)in_stack_ffffffffffffffb8.__r);
        if (bVar1) {
          HighsSplitDeque::popStolen((HighsSplitDeque *)in_stack_ffffffffffffffb8.__r);
          return;
        }
        HighsSplitDeque::yield(in_stack_ffffffffffffffb0);
      }
      in_stack_ffffffffffffffb0 = (HighsSplitDeque *)std::chrono::_V2::system_clock::now();
      in_stack_ffffffffffffffb8 =
           std::chrono::operator-
                     (in_stack_ffffffffffffffb8.__r,
                      (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_ffffffffffffffb0);
      std::chrono::
      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                (in_stack_ffffffffffffffa8);
      rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000L>_> *)&stack0xffffffffffffffc0);
      if (4999 < rVar3) break;
      local_20 = local_20 << 1;
    }
    bVar1 = HighsTask::isFinished((HighsTask *)in_stack_ffffffffffffffb8.__r);
    if (!bVar1) {
      HighsSplitDeque::waitForTaskToFinish(unaff_retaddr,(HighsTask *)in_RDI,in_RSI);
    }
  }
  HighsSplitDeque::popStolen((HighsSplitDeque *)in_stack_ffffffffffffffb8.__r);
  return;
}

Assistant:

static void sync_stolen_task(HighsSplitDeque* localDeque,
                               HighsTask* stolenTask) {
    HighsSplitDeque* stealer;
    if (!localDeque->leapfrogStolenTask(stolenTask, stealer)) {
      const int numWorkers = localDeque->getNumWorkers();
      int numTries = HighsSchedulerConstants::kNumTryFac * (numWorkers - 1);

      auto tStart = std::chrono::high_resolution_clock::now();

      while (true) {
        for (int s = 0; s < numTries; ++s) {
          if (stolenTask->isFinished()) {
            localDeque->popStolen();
            return;
          }
          localDeque->yield();
        }

        auto numMicroSecs =
            std::chrono::duration_cast<std::chrono::microseconds>(
                std::chrono::high_resolution_clock::now() - tStart)
                .count();

        if (numMicroSecs < HighsSchedulerConstants::kMicroSecsBeforeSleep)
          numTries *= 2;
        else
          break;
      }

      if (!stolenTask->isFinished())
        localDeque->waitForTaskToFinish(stolenTask, stealer);
    }

    localDeque->popStolen();
  }